

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O2

void __thiscall
slang::analysis::AnalysisScopeVisitor::visitMembers<slang::ast::SpecifyBlockSymbol>
          (AnalysisScopeVisitor *this,SpecifyBlockSymbol *symbol)

{
  iterator this_00;
  Symbol *member;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  sVar1;
  
  sVar1 = ast::Scope::members(&symbol->super_Scope);
  for (this_00 = sVar1._M_begin.current; this_00.current != sVar1._M_end.current.current;
      this_00.current = (this_00.current)->nextInScope) {
    ast::Symbol::visit<slang::analysis::AnalysisScopeVisitor&>(this_00.current,this);
  }
  return;
}

Assistant:

void visitMembers(const T& symbol) {
        for (auto& member : symbol.members())
            member.visit(*this);
    }